

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O3

void __thiscall
wabt::ObjdumpLocalNames::Set
          (ObjdumpLocalNames *this,Index function_index,Index param_2,string_view name)

{
  mapped_type *this_00;
  key_type local_50;
  long *local_48 [2];
  long local_38 [2];
  
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_48,name._M_str,name._M_str + name._M_len);
  local_50.first = function_index;
  local_50.second = param_2;
  this_00 = std::
            map<std::pair<unsigned_int,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this->names,&local_50);
  std::__cxx11::string::operator=((string *)this_00,(string *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  return;
}

Assistant:

void ObjdumpLocalNames::Set(Index function_index,
                            Index local_index,
                            std::string_view name) {
  names[std::pair<Index, Index>(function_index, local_index)] =
      std::string(name);
}